

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_instance_t *
wasm_instance_new(wasm_store_t *store,wasm_module_t *module,wasm_extern_t **imports,
                 wasm_trap_t **trap_out)

{
  bool bVar1;
  Module *this;
  vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_> *this_00;
  size_type sVar2;
  Object *pOVar3;
  wasm_trap_t *this_01;
  Ptr *in_R9;
  RefPtr<wabt::interp::Instance> local_c8;
  undefined4 local_ac;
  RefPtr<wabt::interp::Trap> local_a8;
  size_t local_90;
  undefined1 local_88 [8];
  Ptr instance;
  Ptr trap;
  ulong local_50;
  size_t i;
  RefVec import_refs;
  wasm_trap_t **trap_out_local;
  wasm_extern_t **imports_local;
  wasm_module_t *module_local;
  wasm_store_t *store_local;
  
  import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)trap_out;
  fprintf(_stderr,"CAPI: [%s] %p %p\n","wasm_instance_new",store,module);
  if (module == (wasm_module_t *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x2de,
                  "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
                 );
  }
  if (store != (wasm_store_t *)0x0) {
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
              ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&i);
    local_50 = 0;
    while( true ) {
      this = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
      this_00 = wabt::interp::Module::import_types(this);
      sVar2 = std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::size
                        (this_00);
      if (sVar2 <= local_50) break;
      pOVar3 = wabt::interp::RefPtr<wabt::interp::Object>::operator->
                         ((RefPtr<wabt::interp::Object> *)imports[local_50]);
      trap.root_index_ = (Index)wabt::interp::Object::self(pOVar3);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&i,
                 (value_type *)&trap.root_index_);
      local_50 = local_50 + 1;
    }
    wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
              ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
    pOVar3 = wabt::interp::RefPtr<wabt::interp::Object>::operator->
                       ((RefPtr<wabt::interp::Object> *)module);
    local_90 = (size_t)wabt::interp::Object::self(pOVar3);
    wabt::interp::Instance::Instantiate
              ((Ptr *)local_88,(Instance *)store,(Store *)local_90,(Ref)&i,
               (RefVec *)&instance.root_index_,in_R9);
    bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)&instance.root_index_);
    if (bVar1) {
      this_01 = (wasm_trap_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
                (&local_a8,(RefPtr<wabt::interp::Trap> *)&instance.root_index_);
      wasm_trap_t::wasm_trap_t(this_01,&local_a8);
      (import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage)->index = (size_t)this_01;
      wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr(&local_a8);
      store_local = (wasm_store_t *)0x0;
    }
    else {
      store_local = (wasm_store_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Instance>::RefPtr
                (&local_c8,(RefPtr<wabt::interp::Instance> *)local_88);
      wasm_instance_t::wasm_instance_t((wasm_instance_t *)store_local,&local_c8);
      wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr(&local_c8);
    }
    local_ac = 1;
    wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr
              ((RefPtr<wabt::interp::Instance> *)local_88);
    wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr
              ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
              ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&i);
    return (wasm_instance_t *)store_local;
  }
  __assert_fail("store",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x2df,
                "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
               );
}

Assistant:

own wasm_instance_t* wasm_instance_new(wasm_store_t* store,
                                       const wasm_module_t* module,
                                       const wasm_extern_t* const imports[],
                                       own wasm_trap_t** trap_out) {
  TRACE("%p %p", store, module);
  assert(module);
  assert(store);

  RefVec import_refs;
  for (size_t i = 0; i < module->As<Module>()->import_types().size(); i++) {
    import_refs.push_back(imports[i]->I->self());
  }

  Trap::Ptr trap;
  auto instance =
      Instance::Instantiate(store->I, module->I->self(), import_refs, &trap);
  if (trap) {
    *trap_out = new wasm_trap_t{trap};
    return nullptr;
  }

  return new wasm_instance_t{instance};
}